

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

SemaphoreWrapper * __thiscall
VulkanUtilities::VulkanLogicalDevice::CreateTimelineSemaphore
          (SemaphoreWrapper *__return_storage_ptr__,VulkanLogicalDevice *this,uint64_t InitialValue,
          char *DebugName)

{
  string msg;
  VkSemaphoreCreateInfo SemaphoreCI;
  string local_68;
  VkSemaphoreCreateInfo local_48;
  
  if ((this->m_EnabledExtFeatures).TimelineSemaphore.timelineSemaphore != 1) {
    Diligent::FormatString<char[26],char[68]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_EnabledExtFeatures.TimelineSemaphore.timelineSemaphore == VK_TRUE",
               (char (*) [68])DebugName);
    Diligent::DebugAssertionFailed
              (local_68._M_dataplus._M_p,"CreateTimelineSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x16e);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_68._M_string_length = 0;
  local_68._M_dataplus._M_p = (pointer)0x3b9df29a;
  local_68.field_2._M_allocated_capacity = 1;
  local_48.flags = 0;
  local_48._20_4_ = 0;
  local_48.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_48._4_4_ = 0;
  local_68.field_2._8_8_ = InitialValue;
  local_48.pNext = &local_68;
  CreateVulkanObject<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17,VkResult(*)(VkDevice_T*,VkSemaphoreCreateInfo_const*,VkAllocationCallbacks_const*,VkSemaphore_T**),VkSemaphoreCreateInfo>
            (__return_storage_ptr__,this,
             (_func_VkResult_VkDevice_T_ptr_VkSemaphoreCreateInfo_ptr_VkAllocationCallbacks_ptr_VkSemaphore_T_ptr_ptr
              *)vkCreateSemaphore,&local_48,DebugName,"timeline semaphore");
  return __return_storage_ptr__;
}

Assistant:

SemaphoreWrapper VulkanLogicalDevice::CreateTimelineSemaphore(uint64_t InitialValue, const char* DebugName) const
{
    VERIFY_EXPR(m_EnabledExtFeatures.TimelineSemaphore.timelineSemaphore == VK_TRUE);

    VkSemaphoreTypeCreateInfo TimelineCI{};
    TimelineCI.sType         = VK_STRUCTURE_TYPE_SEMAPHORE_TYPE_CREATE_INFO;
    TimelineCI.semaphoreType = VK_SEMAPHORE_TYPE_TIMELINE;
    TimelineCI.initialValue  = InitialValue;

    VkSemaphoreCreateInfo SemaphoreCI{};
    SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
    SemaphoreCI.pNext = &TimelineCI;

    return CreateVulkanObject<VkSemaphore, VulkanHandleTypeId::Semaphore>(vkCreateSemaphore, SemaphoreCI, DebugName, "timeline semaphore");
}